

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O3

TEXTURE_FORMAT
Diligent::TextureComponentAttribsToTextureFormat
          (COMPONENT_TYPE CompType,Uint32 ComponentSize,Uint32 NumComponents)

{
  TEXTURE_FORMAT TVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  undefined7 in_register_00000039;
  
  switch((int)CONCAT71(in_register_00000039,CompType)) {
  case 1:
    if (ComponentSize == 4) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x2000600100029;
    }
    else {
      if (ComponentSize != 2) {
        return TEX_FORMAT_UNKNOWN;
      }
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0xa000000220036;
    }
    break;
  case 2:
    if (ComponentSize == 2) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0xd00000025003a;
    }
    else {
      if (ComponentSize != 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x1f00000033003f;
    }
    break;
  case 3:
    if (ComponentSize == 2) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0xb000000230038;
    }
    else {
      if (ComponentSize != 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x1c00000031003d;
    }
    break;
  case 4:
    uVar4 = NumComponents ^ 4 | ComponentSize ^ 1;
    TVar1 = TEX_FORMAT_RGBA8_UNORM_SRGB;
    goto LAB_00709745;
  case 5:
    if (ComponentSize == 4) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x400080012002b;
    }
    else if (ComponentSize == 2) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0xe00000026003b;
    }
    else {
      if (ComponentSize != 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x20000000340040;
    }
    break;
  case 6:
    if (ComponentSize == 4) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x300070011002a;
    }
    else if (ComponentSize == 2) {
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0xc000000240039;
    }
    else {
      if (ComponentSize != 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      if (3 < NumComponents - 1) {
        return TEX_FORMAT_UNKNOWN;
      }
      bVar3 = (char)(NumComponents - 1) * '\x10';
      uVar2 = 0x1e00000032003e;
    }
    break;
  case 7:
    uVar4 = NumComponents ^ 1 | ComponentSize ^ 4;
    TVar1 = TEX_FORMAT_D32_FLOAT;
LAB_00709745:
    if (uVar4 != 0) {
      TVar1 = TEX_FORMAT_UNKNOWN;
    }
    return TVar1;
  default:
    return TEX_FORMAT_UNKNOWN;
  }
  return (TEXTURE_FORMAT)(uVar2 >> (bVar3 & 0x3f));
}

Assistant:

TEXTURE_FORMAT TextureComponentAttribsToTextureFormat(COMPONENT_TYPE CompType, Uint32 ComponentSize, Uint32 NumComponents)
{
    switch (CompType)
    {
        case COMPONENT_TYPE_FLOAT:
            switch (ComponentSize)
            {
                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_FLOAT;
                        case 2: return TEX_FORMAT_RG16_FLOAT;
                        case 4: return TEX_FORMAT_RGBA16_FLOAT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_FLOAT;
                        case 2: return TEX_FORMAT_RG32_FLOAT;
                        case 3: return TEX_FORMAT_RGB32_FLOAT;
                        case 4: return TEX_FORMAT_RGBA32_FLOAT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_SNORM:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_SNORM;
                        case 2: return TEX_FORMAT_RG8_SNORM;
                        case 4: return TEX_FORMAT_RGBA8_SNORM;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_SNORM;
                        case 2: return TEX_FORMAT_RG16_SNORM;
                        case 4: return TEX_FORMAT_RGBA16_SNORM;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UNORM:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_UNORM;
                        case 2: return TEX_FORMAT_RG8_UNORM;
                        case 4: return TEX_FORMAT_RGBA8_UNORM;
                    }

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_UNORM;
                        case 2: return TEX_FORMAT_RG16_UNORM;
                        case 4: return TEX_FORMAT_RGBA16_UNORM;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UNORM_SRGB:
            return ComponentSize == 1 && NumComponents == 4 ? TEX_FORMAT_RGBA8_UNORM_SRGB : TEX_FORMAT_UNKNOWN;

        case COMPONENT_TYPE_SINT:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_SINT;
                        case 2: return TEX_FORMAT_RG8_SINT;
                        case 4: return TEX_FORMAT_RGBA8_SINT;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_SINT;
                        case 2: return TEX_FORMAT_RG16_SINT;
                        case 4: return TEX_FORMAT_RGBA16_SINT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_SINT;
                        case 2: return TEX_FORMAT_RG32_SINT;
                        case 3: return TEX_FORMAT_RGB32_SINT;
                        case 4: return TEX_FORMAT_RGBA32_SINT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_UINT:
            switch (ComponentSize)
            {
                case 1:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R8_UINT;
                        case 2: return TEX_FORMAT_RG8_UINT;
                        case 4: return TEX_FORMAT_RGBA8_UINT;
                    }
                    break;

                case 2:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R16_UINT;
                        case 2: return TEX_FORMAT_RG16_UINT;
                        case 4: return TEX_FORMAT_RGBA16_UINT;
                    }
                    break;

                case 4:
                    switch (NumComponents)
                    {
                        case 1: return TEX_FORMAT_R32_UINT;
                        case 2: return TEX_FORMAT_RG32_UINT;
                        case 3: return TEX_FORMAT_RGB32_UINT;
                        case 4: return TEX_FORMAT_RGBA32_UINT;
                    }
                    break;
            }
            break;

        case COMPONENT_TYPE_DEPTH:
            return ComponentSize == 4 && NumComponents == 1 ? TEX_FORMAT_D32_FLOAT : TEX_FORMAT_UNKNOWN;

        default:
            break;
    }

    return TEX_FORMAT_UNKNOWN;
}